

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Progress.cxx
# Opt level: O3

void __thiscall Fl_Progress::draw(Fl_Progress *this)

{
  int X;
  float fVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Color FVar9;
  int iVar10;
  int iVar11;
  Fl_Color FVar12;
  uint uVar13;
  int iVar14;
  
  iVar5 = Fl::box_dx((uint)(this->super_Fl_Widget).box_);
  iVar6 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
  iVar7 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
  iVar8 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
  iVar3 = (this->super_Fl_Widget).x_;
  iVar4 = (this->super_Fl_Widget).w_;
  X = iVar5 + iVar3;
  iVar7 = iVar4 - iVar7;
  fVar1 = this->minimum_;
  if ((this->maximum_ <= fVar1) ||
     (iVar14 = (int)(((this->value_ - fVar1) * (float)iVar4) / (this->maximum_ - fVar1) + 0.5),
     iVar14 < 1)) {
    bVar2 = (this->super_Fl_Widget).box_;
    iVar5 = (this->super_Fl_Widget).y_;
    iVar14 = (this->super_Fl_Widget).h_;
    iVar11 = Fl_Widget::active_r(&this->super_Fl_Widget);
    FVar12 = (this->super_Fl_Widget).color_;
    if (iVar11 == 0) {
      FVar12 = fl_inactive(FVar12);
    }
    Fl_Widget::draw_box(&this->super_Fl_Widget,(uint)bVar2,iVar3,iVar5,iVar4,iVar14,FVar12);
    Fl_Widget::draw_label
              (&this->super_Fl_Widget,X,iVar6 + (this->super_Fl_Widget).y_,iVar7,
               (this->super_Fl_Widget).h_ - iVar8);
    return;
  }
  FVar12 = (this->super_Fl_Widget).label_.color;
  FVar9 = fl_contrast(FVar12,(this->super_Fl_Widget).color2_);
  (this->super_Fl_Widget).label_.color = FVar9;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Widget).x_,
             (ulong)(uint)(this->super_Fl_Widget).y_,(ulong)(uint)(iVar5 + iVar14),
             (ulong)(uint)(this->super_Fl_Widget).h_);
  bVar2 = (this->super_Fl_Widget).box_;
  iVar3 = (this->super_Fl_Widget).x_;
  iVar4 = (this->super_Fl_Widget).y_;
  iVar5 = (this->super_Fl_Widget).w_;
  iVar11 = (this->super_Fl_Widget).h_;
  iVar10 = Fl_Widget::active_r(&this->super_Fl_Widget);
  FVar9 = (this->super_Fl_Widget).color2_;
  if (iVar10 == 0) {
    FVar9 = fl_inactive(FVar9);
  }
  Fl_Widget::draw_box(&this->super_Fl_Widget,(uint)bVar2,iVar3,iVar4,iVar5,iVar11,FVar9);
  Fl_Widget::draw_label
            (&this->super_Fl_Widget,X,(this->super_Fl_Widget).y_ + iVar6,iVar7,
             (this->super_Fl_Widget).h_ - iVar8);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  (this->super_Fl_Widget).label_.color = FVar12;
  iVar3 = (this->super_Fl_Widget).w_;
  uVar13 = iVar3 - iVar14;
  if (uVar13 != 0 && iVar14 <= iVar3) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(uint)(iVar14 + X),(ulong)(uint)(this->super_Fl_Widget).y_,
               (ulong)uVar13,(ulong)(uint)(this->super_Fl_Widget).h_);
    bVar2 = (this->super_Fl_Widget).box_;
    iVar3 = (this->super_Fl_Widget).x_;
    iVar4 = (this->super_Fl_Widget).y_;
    iVar5 = (this->super_Fl_Widget).w_;
    iVar14 = (this->super_Fl_Widget).h_;
    iVar11 = Fl_Widget::active_r(&this->super_Fl_Widget);
    FVar12 = (this->super_Fl_Widget).color_;
    if (iVar11 == 0) {
      FVar12 = fl_inactive(FVar12);
    }
    Fl_Widget::draw_box(&this->super_Fl_Widget,(uint)bVar2,iVar3,iVar4,iVar5,iVar14,FVar12);
    Fl_Widget::draw_label
              (&this->super_Fl_Widget,X,iVar6 + (this->super_Fl_Widget).y_,iVar7,
               (this->super_Fl_Widget).h_ - iVar8);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    return;
  }
  return;
}

Assistant:

void Fl_Progress::draw()
{
  int	progress;	// Size of progress bar...
  int	bx, by, bw, bh;	// Box areas...
  int	tx, tw;		// Temporary X + width


  // Get the box borders...
  bx = Fl::box_dx(box());
  by = Fl::box_dy(box());
  bw = Fl::box_dw(box());
  bh = Fl::box_dh(box());

  tx = x() + bx;
  tw = w() - bw;

  // Draw the progress bar...
  if (maximum_ > minimum_)
    progress = (int)(w() * (value_ - minimum_) / (maximum_ - minimum_) + 0.5f);
  else
    progress = 0;

  // Draw the box and label...
  if (progress > 0) {
    Fl_Color c = labelcolor();
    labelcolor(fl_contrast(labelcolor(), selection_color()));

    fl_push_clip(x(), y(), progress + bx, h());
      draw_box(box(), x(), y(), w(), h(), active_r() ? selection_color() : fl_inactive(selection_color()));
      draw_label(tx, y() + by, tw, h() - bh);
    fl_pop_clip();

    labelcolor(c);

    if (progress<w()) {
      fl_push_clip(tx + progress, y(), w() - progress, h());
        draw_box(box(), x(), y(), w(), h(), active_r() ? color() : fl_inactive(color()));
        draw_label(tx, y() + by, tw, h() - bh);
      fl_pop_clip();
    }
  } else {
    draw_box(box(), x(), y(), w(), h(), active_r() ? color() : fl_inactive(color()));
    draw_label(tx, y() + by, tw, h() - bh);
  }
}